

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

string * common::FeeModes(string *__return_storage_ptr__,string *delimiter)

{
  pointer pcVar1;
  pointer ppVar2;
  bool bVar3;
  pointer ppVar4;
  long in_FS_OFFSET;
  long *local_78;
  size_type local_70;
  long local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FeeModeMap_abi_cxx11_();
  ppVar2 = FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity._0_4_ =
       local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  if (FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    bVar3 = true;
    ppVar4 = FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (!bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_58,(delimiter->_M_dataplus)._M_p,delimiter->_M_string_length);
      }
      pcVar1 = (ppVar4->first)._M_dataplus._M_p;
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + (ppVar4->first)._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_58,(char *)local_78,local_70);
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      ppVar4 = ppVar4 + 1;
      bVar3 = false;
    } while (ppVar4 != ppVar2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                    local_58.field_2._M_allocated_capacity._0_4_);
      goto LAB_00d262f7;
    }
  }
  *(undefined4 *)&__return_storage_ptr__->field_2 = local_58.field_2._M_allocated_capacity._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 4) =
       local_58.field_2._M_allocated_capacity._4_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 8) = local_58.field_2._8_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 0xc) = local_58.field_2._12_4_;
LAB_00d262f7:
  __return_storage_ptr__->_M_string_length = local_58._M_string_length;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FeeModes(const std::string& delimiter)
{
    return Join(FeeModeMap(), delimiter, [&](const std::pair<std::string, FeeEstimateMode>& i) { return i.first; });
}